

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O1

void es5503_pcm_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ushort *puVar5;
  int resshift;
  int iVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if ((*(long *)((long)param + 0x10) != 0) && (samples != 0)) {
    bVar7 = *(byte *)((long)param + 0x340) & 0xfe;
    uVar13 = 0;
    do {
      if (*(char *)((long)param + 0x338) != '\0') {
        uVar14 = 0;
        do {
          bVar10 = *(byte *)((long)param + uVar14 * 0x18 + 0x3c);
          if (((bVar10 & 1) == 0) &&
             (puVar5 = (ushort *)((long)param + uVar14 * 0x18 + 0x38),
             *(char *)((long)puVar5 + 0x15) == '\0')) {
            uVar12 = (ulong)((uint)(byte)puVar5[6] * 4);
            uVar11 = *(uint *)((long)wavemasks + uVar12);
            uVar3 = *(uint *)(puVar5 + 4);
            uVar2 = puVar5[1];
            resshift = resshifts[*(byte *)((long)puVar5 + 0xd)] - (uint)(byte)puVar5[6];
            bVar8 = *(byte *)((long)param + 0x341) & bVar10 >> 4;
            uVar9 = *(uint *)(puVar5 + 8) >> ((byte)resshift & 0x1f);
            uVar4 = *(uint *)((long)accmasks + uVar12);
            *(uint *)(puVar5 + 8) = (uint)*puVar5 + *(uint *)(puVar5 + 8);
            *(byte *)((long)param + 0x33a) = bVar10 >> 4;
            bVar1 = *(byte *)(*(long *)((long)param + 0x10) +
                             (ulong)((uVar4 & uVar9) + (uVar11 & uVar3)));
            *(byte *)(puVar5 + 3) = bVar1;
            uVar11 = (uint)bVar1;
            if (uVar11 == 0) {
              iVar6 = 1;
            }
            else {
              if ((bVar10 & 6) == 4) {
                if ((uVar14 & 1) == 0) {
                  iVar6 = (uint)*(byte *)((long)puVar5 + 5) * (uVar11 - 0x80);
                }
                else {
                  iVar6 = 0;
                  if ((uVar14 < 0x1f) && ((*(byte *)((long)param + uVar14 * 0x18 + 0x54) & 1) == 0))
                  {
                    *(byte *)((long)param + uVar14 * 0x18 + 0x55) = bVar1;
                  }
                }
              }
              else {
                iVar6 = (uint)*(byte *)((long)puVar5 + 5) * (uVar11 - 0x80);
              }
              bVar10 = 0;
              if (bVar7 != 0) {
                do {
                  if (bVar8 == bVar10) {
                    outputs[bVar10 & 1][uVar13] = outputs[bVar10 & 1][uVar13] + iVar6;
                  }
                  bVar10 = bVar10 + 1;
                } while (bVar7 != bVar10);
              }
              bVar1 = *(byte *)((long)param + 0x340);
              if (bVar10 < bVar1) {
                iVar6 = iVar6 * 0xb5 >> 8;
                do {
                  if (bVar8 == bVar10) {
                    (*outputs)[uVar13] = (*outputs)[uVar13] + iVar6;
                    outputs[1][uVar13] = outputs[1][uVar13] + iVar6;
                  }
                  bVar10 = bVar10 + 1;
                } while (bVar10 < bVar1);
              }
              iVar6 = 0;
              if (uVar9 < (uVar2 - 1 & 0xffff)) goto LAB_0016ea10;
            }
            es5503_halt_osc((ES5503Chip *)param,(int)uVar14,iVar6,(UINT32 *)(puVar5 + 8),resshift);
          }
LAB_0016ea10:
          uVar14 = uVar14 + 1;
        } while (uVar14 < *(byte *)((long)param + 0x338));
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != samples);
  }
  return;
}

Assistant:

static void es5503_pcm_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	UINT8 osc;
	UINT32 snum;
	UINT32 ramptr;
	ES5503Chip *chip = (ES5503Chip *)param;
	UINT8 chnsStereo, chan;

	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	if (chip->docram == NULL)
		return;

	chnsStereo = chip->output_channels & ~1;
	for (snum = 0; snum < samples; snum++)
	{
		for (osc = 0; osc < chip->oscsenabled; osc++)
		{
			ES5503Osc *pOsc = &chip->oscillators[osc];

			if (!(pOsc->control & 1) && ! pOsc->Muted)
			{
				UINT32 wtptr = pOsc->wavetblpointer & wavemasks[pOsc->wavetblsize];
				UINT32 altram;
				UINT16 wtsize = pOsc->wtsize - 1;
				UINT8 chnMask = (pOsc->control >> 4) & 0x0F;
				int resshift = resshifts[pOsc->resolution] - pOsc->wavetblsize;
				UINT32 sizemask = accmasks[pOsc->wavetblsize];
				const int mode = (pOsc->control>>1) & 3;

				chnMask &= chip->outchn_mask;
				altram = pOsc->accumulator >> resshift;
				ramptr = altram & sizemask;

				pOsc->accumulator += pOsc->freq;

				// channel strobe is always valid when reading; this allows potentially banking per voice
				chip->channel_strobe = (pOsc->control>>4) & 0xf;
				pOsc->data = chip->docram[ramptr + wtptr];

				if (pOsc->data == 0x00)
				{
					es5503_halt_osc(chip, osc, 1, &pOsc->accumulator, resshift);
				}
				else
				{
					INT32 outData;
					if (mode != MODE_SYNCAM)
					{
						outData = (pOsc->data - 0x80) * (INT16)pOsc->vol;
					}
					else
					{
						// if we're odd, we play nothing ourselves
						if (osc & 1)
						{
							if (osc < 31)
							{
								// if the next oscillator up is playing, it's volume becomes our control
								if (!(chip->oscillators[osc + 1].control & 1))
								{
									chip->oscillators[osc + 1].vol = pOsc->data;
								}
							}
							outData = 0;
						}
						else    // hard sync, both oscillators play?
						{
							outData = (pOsc->data - 0x80) * (INT16)pOsc->vol;
						}
					}

					// send groups of 2 channels to L or R
					for (chan = 0; chan < chnsStereo; chan ++)
					{
						if (chan == chnMask)
							outputs[chan & 1][snum] += outData;
					}
					outData = (outData * 181) >> 8;	// outData *= sqrt(2)
					// send remaining channels to L+R
					for (; chan < chip->output_channels; chan ++)
					{
						if (chan == chnMask)
						{
							outputs[0][snum] += outData;
							outputs[1][snum] += outData;
						}
					}

					if (altram >= wtsize)
					{
						es5503_halt_osc(chip, osc, 0, &pOsc->accumulator, resshift);
					}
				}
			}	// end if (oscillators[osc] playing)
		}	// end for (osc)
	}	// end for (snum)
}